

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcRootLogLikelihoods
          (BeagleCPU4StateImpl<float,_1,_0> *this,int bufferIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood)

{
  float fVar1;
  int iVar2;
  float *pfVar3;
  float *pfVar4;
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  float *integrationTmp;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  
  uVar8 = (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount;
  pfVar3 = (this->super_BeagleCPUImpl<float,_1,_0>).gCategoryWeights[categoryWeightsIndex];
  pfVar4 = (this->super_BeagleCPUImpl<float,_1,_0>).gPartials[bufferIndex];
  integrationTmp = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
  uVar8 = ~((int)uVar8 >> 0x1f) & uVar8;
  uVar10 = 0;
  fVar1 = *pfVar3;
  uVar7 = uVar8;
  while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
    integrationTmp[uVar10] = fVar1 * pfVar4[uVar10];
    integrationTmp[uVar10 + 1] = fVar1 * pfVar4[uVar10 + 1];
    integrationTmp[uVar10 + 2] = fVar1 * pfVar4[uVar10 + 2];
    integrationTmp[uVar10 + 3] = fVar1 * pfVar4[uVar10 + 3];
    uVar10 = uVar10 + 4;
  }
  iVar6 = (this->super_BeagleCPUImpl<float,_1,_0>).kExtraPatterns;
  iVar2 = (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
  for (lVar11 = 1; lVar11 < iVar2; lVar11 = lVar11 + 1) {
    fVar1 = pfVar3[lVar11];
    integrationTmp = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
    iVar9 = (int)uVar10;
    lVar12 = 0;
    uVar7 = uVar8;
    while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
      auVar5 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[iVar9 + lVar12]),ZEXT416((uint)fVar1),
                               ZEXT416((uint)integrationTmp[lVar12]));
      integrationTmp[lVar12] = auVar5._0_4_;
      auVar5 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[(long)iVar9 + lVar12 + 1]),ZEXT416((uint)fVar1),
                               ZEXT416((uint)integrationTmp[lVar12 + 1]));
      integrationTmp[lVar12 + 1] = auVar5._0_4_;
      auVar5 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[(long)iVar9 + lVar12 + 2]),ZEXT416((uint)fVar1),
                               ZEXT416((uint)integrationTmp[lVar12 + 2]));
      integrationTmp[lVar12 + 2] = auVar5._0_4_;
      auVar5 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[(long)iVar9 + lVar12 + 3]),ZEXT416((uint)fVar1),
                               ZEXT416((uint)integrationTmp[lVar12 + 3]));
      integrationTmp[lVar12 + 3] = auVar5._0_4_;
      lVar12 = lVar12 + 4;
    }
    uVar10 = (ulong)(uint)((int)lVar12 + iVar9 + iVar6 * 4);
  }
  iVar6 = integrateOutStatesAndScale
                    (this,integrationTmp,stateFrequenciesIndex,scalingFactorsIndex,
                     outSumLogLikelihood);
  return iVar6;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoods(const int bufferIndex,
                                                           const int categoryWeightsIndex,
                                                           const int stateFrequenciesIndex,
                                                const int scalingFactorsIndex,
                                                double* outSumLogLikelihood) {

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    assert(rootPartials);
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];

    int u = 0;
    int v = 0;
    const REALTYPE wt0 = wt[0];
    for (int k = 0; k < kPatternCount; k++) {
        integrationTmp[v    ] = rootPartials[v    ] * wt0;
        integrationTmp[v + 1] = rootPartials[v + 1] * wt0;
        integrationTmp[v + 2] = rootPartials[v + 2] * wt0;
        integrationTmp[v + 3] = rootPartials[v + 3] * wt0;
        v += 4;
    }
    for (int l = 1; l < kCategoryCount; l++) {
        u = 0;
        const REALTYPE wtl = wt[l];
        for (int k = 0; k < kPatternCount; k++) {
            integrationTmp[u    ] += rootPartials[v    ] * wtl;
            integrationTmp[u + 1] += rootPartials[v + 1] * wtl;
            integrationTmp[u + 2] += rootPartials[v + 2] * wtl;
            integrationTmp[u + 3] += rootPartials[v + 3] * wtl;

            u += 4;
            v += 4;
        }
		v += 4 * kExtraPatterns;
    }

    return integrateOutStatesAndScale(integrationTmp, stateFrequenciesIndex, scalingFactorsIndex, outSumLogLikelihood);
}